

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_info.cpp
# Opt level: O0

unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true> __thiscall
duckdb::TransactionInfo::Copy(TransactionInfo *this)

{
  pointer pTVar1;
  long in_RSI;
  __uniq_ptr_impl<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_> in_RDI;
  templated_unique_single_t *result;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar2;
  
  make_uniq<duckdb::TransactionInfo,duckdb::TransactionType_const&>
            ((TransactionType *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  uVar2 = *(undefined1 *)(in_RSI + 10);
  pTVar1 = unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>::
           operator->((unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>
                       *)in_RDI._M_t.
                         super__Tuple_impl<0UL,_duckdb::TransactionInfo_*,_std::default_delete<duckdb::TransactionInfo>_>
                         .super__Head_base<0UL,_duckdb::TransactionInfo_*,_false>._M_head_impl);
  (pTVar1->super_ParseInfo).field_0xa = uVar2;
  return (unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>)
         (_Tuple_impl<0UL,_duckdb::TransactionInfo_*,_std::default_delete<duckdb::TransactionInfo>_>
         )in_RDI._M_t.
          super__Tuple_impl<0UL,_duckdb::TransactionInfo_*,_std::default_delete<duckdb::TransactionInfo>_>
          .super__Head_base<0UL,_duckdb::TransactionInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<TransactionInfo> TransactionInfo::Copy() const {
	auto result = make_uniq<TransactionInfo>(type);
	result->modifier = modifier;
	return result;
}